

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O0

list_conflict ForListInsertsort(list_conflict r,list *tail,int p)

{
  int iVar1;
  list_conflict local_38;
  list_conflict t;
  list_conflict la;
  list_conflict fi;
  int p_local;
  list *tail_local;
  list_conflict r_local;
  
  tail_local = (list *)r->next;
  t = r;
  la = r;
  while (tail_local != (list *)0x0) {
    iVar1 = scmp((uchar *)((long)&(*tail_local)->str + (long)p),t->str + p);
    if (iVar1 < 0) {
      iVar1 = scmp((uchar *)((long)&(*tail_local)->str + (long)p),la->str + p);
      if (iVar1 < 1) {
        t->next = tail_local[1];
        tail_local[1] = la;
        la = (list_conflict)tail_local;
      }
      else {
        local_38 = la;
        while (iVar1 = scmp((uchar *)((long)&(*tail_local)->str + (long)p),local_38->next->str + p),
              -1 < iVar1) {
          local_38 = local_38->next;
        }
        t->next = tail_local[1];
        tail_local[1] = local_38->next;
        local_38->next = (list)tail_local;
      }
    }
    else {
      t = (list_conflict)tail_local;
    }
    tail_local = (list *)t->next;
  }
  *tail = t;
  return la;
}

Assistant:

list ForListInsertsort(list r, list *tail, int p)
{
   list fi, la, t;

   for (fi = la = r, r = r->next; r; r = la->next)
      if (scmp(r->str+p, la->str+p) >= 0) /* add to tail */
         la = r;
      else if (scmp(r->str+p, fi->str+p) <= 0) { /* add to head */
         la->next = r->next;
         r->next = fi;
         fi = r;
      } else { /* insert into middle */
         for (t = fi; scmp(r->str+p, t->next->str+p) >= 0; )
            t = t->next;
         la->next = r->next;
         r->next = t->next;
         t->next = r;
      }
   *tail = la;
   return fi;
}